

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O0

void icu_63::DateFormatSymbols::assignArray
               (UnicodeString **dstArray,int32_t *dstCount,UnicodeString *srcArray,int32_t srcCount)

{
  UnicodeString *pUVar1;
  int local_28;
  int32_t i;
  int32_t srcCount_local;
  UnicodeString *srcArray_local;
  int32_t *dstCount_local;
  UnicodeString **dstArray_local;
  
  *dstCount = srcCount;
  pUVar1 = newUnicodeStringArray((long)srcCount);
  *dstArray = pUVar1;
  if (*dstArray != (UnicodeString *)0x0) {
    for (local_28 = 0; local_28 < srcCount; local_28 = local_28 + 1) {
      icu_63::UnicodeString::fastCopyFrom(*dstArray + local_28,srcArray + local_28);
    }
  }
  return;
}

Assistant:

void
DateFormatSymbols::assignArray(UnicodeString*& dstArray,
                               int32_t& dstCount,
                               const UnicodeString* srcArray,
                               int32_t srcCount)
{
    // assignArray() is only called by copyData() and initializeData(), which in turn
    // implements the copy constructor and the assignment operator.
    // All strings in a DateFormatSymbols object are created in one of the following
    // three ways that all allow to safely use UnicodeString::fastCopyFrom():
    // - readonly-aliases from resource bundles
    // - readonly-aliases or allocated strings from constants
    // - safely cloned strings (with owned buffers) from setXYZ() functions
    //
    // Note that this is true for as long as DateFormatSymbols can be constructed
    // only from a locale bundle or set via the cloning API,
    // *and* for as long as all the strings are in *private* fields, preventing
    // a subclass from creating these strings in an "unsafe" way (with respect to fastCopyFrom()).
    dstCount = srcCount;
    dstArray = newUnicodeStringArray(srcCount);
    if(dstArray != NULL) {
        int32_t i;
        for(i=0; i<srcCount; ++i) {
            dstArray[i].fastCopyFrom(srcArray[i]);
        }
    }
}